

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O0

void __thiscall DPusher::Tick(DPusher *this)

{
  FPortalGroupArray *this_00;
  secplane_t *this_01;
  bool bVar1;
  uint uVar2;
  sector_t *this_02;
  AActor *pAVar3;
  AActor *t2;
  MetaClass *pMVar4;
  sector_t *psVar5;
  double dVar6;
  double dVar7;
  bool local_346;
  byte local_345;
  byte local_331;
  TVector2<double> local_310;
  TVector2<double> local_300;
  secplane_t *local_2f0;
  secplane_t *floor;
  TVector2<double> local_2d8;
  TVector2<double> local_2c8;
  undefined1 local_2b8 [8];
  DVector2 pushvel;
  DVector3 pos_1;
  sector_t *hsec;
  TAngle<double> local_280;
  DAngle pushangle;
  double speed;
  double dist;
  DVector2 pos;
  TFlags<ActorFlag,_unsigned_int> local_248;
  TFlags<ActorFlag,_unsigned_int> local_244;
  TFlags<ActorFlag2,_unsigned_int> local_240;
  byte local_239;
  AActor *pAStack_238;
  bool pusharound;
  AActor *thing_1;
  CheckResult cres;
  undefined1 local_1f8 [8];
  FMultiBlockThingsIterator it;
  FPortalGroupArray check;
  double ht;
  msecnode_t *node;
  AActor *thing;
  sector_t *sec;
  DPusher *this_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&var_pushers);
  if ((bVar1) && (this_02 = sectors + this->m_Affectee, (this_02->Flags & 0x20) != 0)) {
    if (this->m_Type == p_push) {
      this_00 = (FPortalGroupArray *)(it.bbox.m_Box + 3);
      FPortalGroupArray::FPortalGroupArray(this_00,0);
      pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->m_Source);
      FMultiBlockThingsIterator::FMultiBlockThingsIterator
                ((FMultiBlockThingsIterator *)local_1f8,this_00,pAVar3,this->m_Radius,false);
      FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&thing_1);
      while (bVar1 = FMultiBlockThingsIterator::Next
                               ((FMultiBlockThingsIterator *)local_1f8,(CheckResult *)&thing_1),
            bVar1) {
        pAStack_238 = thing_1;
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_240,(int)thing_1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_240);
        local_331 = 0;
        if (uVar2 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_244,
                     (int)pAStack_238 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_244);
          local_331 = uVar2 != 0 ^ 0xff;
        }
        local_239 = local_331 & 1;
        uVar2 = FIntCVar::operator_cast_to_int(&compatflags);
        if ((uVar2 & 0x1000000) != 0) {
          if (((local_239 & 1) != 0) || (bVar1 = AActor::IsSentient(pAStack_238), bVar1)) {
LAB_006ab82c:
            local_346 = false;
            if (pAStack_238->player != (player_t *)0x0) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        ((TFlags<ActorFlag,_unsigned_int> *)((long)&pos.Y + 4),
                         (int)pAStack_238 +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
              uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Y + 4));
              local_346 = uVar2 != 0;
            }
            local_345 = local_346 ^ 0xff;
          }
          else {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_248,
                       (int)pAStack_238 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE)
                      );
            uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_248);
            local_345 = 0;
            if (uVar2 != 0) goto LAB_006ab82c;
          }
          local_239 = local_345 & 1;
        }
        if ((local_239 & 1) != 0) {
          pAVar3 = TObjPtr<AActor>::operator->(&this->m_Source);
          AActor::Vec2To((AActor *)&dist,pAVar3);
          dVar6 = TVector2<double>::Length((TVector2<double> *)&dist);
          pAVar3 = pAStack_238;
          pushangle.Degrees = (this->m_Magnitude - dVar6 / 2.0) / 256.0;
          if (0.0 < pushangle.Degrees) {
            t2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->m_Source);
            bVar1 = P_CheckSight(pAVar3,t2,1);
            if (bVar1) {
              TVector2<double>::Angle((TVector2<double> *)&stack0xfffffffffffffd88);
              pAVar3 = TObjPtr<AActor>::operator->(&this->m_Source);
              pMVar4 = AActor::GetClass(pAVar3);
              bVar1 = FName::operator==(&(pMVar4->super_PClass).super_PStruct.super_PNamedType.
                                         TypeName,NAME_PointPuller);
              if (bVar1) {
                TAngle<double>::operator+=((TAngle<double> *)&stack0xfffffffffffffd88,180.0);
              }
              pAVar3 = pAStack_238;
              TAngle<double>::TAngle(&local_280,(TAngle<double> *)&stack0xfffffffffffffd88);
              AActor::Thrust(pAVar3,&local_280,pushangle.Degrees);
            }
          }
        }
      }
      FMultiBlockThingsIterator::~FMultiBlockThingsIterator((FMultiBlockThingsIterator *)local_1f8);
      FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(it.bbox.m_Box + 3));
    }
    else {
      for (ht = (double)this_02->touching_thinglist; ht != 0.0; ht = *(double *)((long)ht + 0x28)) {
        pAVar3 = *(AActor **)((long)ht + 8);
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)((long)&hsec + 4),
                   (int)pAVar3 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&hsec + 4));
        bVar1 = true;
        if (uVar2 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)&hsec,
                     (int)pAVar3 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&hsec);
          bVar1 = uVar2 != 0;
        }
        if (!bVar1) {
          psVar5 = sector_t::GetHeightSec(this_02);
          AActor::PosRelative((DVector3 *)&pushvel.Y,pAVar3,this_02);
          TVector2<double>::TVector2((TVector2<double> *)local_2b8);
          if (this->m_Type == p_wind) {
            if (psVar5 == (sector_t *)0x0) {
              dVar6 = AActor::Z(pAVar3);
              if (dVar6 < pAVar3->floorz || dVar6 == pAVar3->floorz) {
                TVector2<double>::operator/(&local_2c8,2.0);
                TVector2<double>::operator=((TVector2<double> *)local_2b8,&local_2c8);
              }
              else {
                TVector2<double>::operator=((TVector2<double> *)local_2b8,&this->m_PushVec);
              }
            }
            else {
              TVector2<double>::TVector2(&local_2d8,(TVector3<double> *)&pushvel.Y);
              dVar6 = secplane_t::ZatPoint(&psVar5->floorplane,&local_2d8);
              dVar7 = AActor::Z(pAVar3);
              if (dVar7 <= dVar6) {
                if (dVar6 <= pAVar3->player->viewz) {
                  TVector2<double>::operator/((TVector2<double> *)&floor,2.0);
                  TVector2<double>::operator=
                            ((TVector2<double> *)local_2b8,(TVector2<double> *)&floor);
                }
                else {
                  TVector2<double>::Zero((TVector2<double> *)local_2b8);
                }
              }
              else {
                TVector2<double>::operator=((TVector2<double> *)local_2b8,&this->m_PushVec);
              }
            }
          }
          else {
            if (psVar5 == (sector_t *)0x0) {
              psVar5 = this_02;
            }
            local_2f0 = &psVar5->floorplane;
            dVar6 = AActor::Z(pAVar3);
            this_01 = local_2f0;
            TVector2<double>::TVector2(&local_300,(TVector3<double> *)&pushvel.Y);
            dVar7 = secplane_t::ZatPoint(this_01,&local_300);
            if (dVar6 <= dVar7) {
              TVector2<double>::operator=((TVector2<double> *)local_2b8,&this->m_PushVec);
            }
            else {
              TVector2<double>::Zero((TVector2<double> *)local_2b8);
            }
          }
          TVector2<double>::operator/(&local_310,128.0);
          TVector3<double>::operator+=(&pAVar3->Vel,&local_310);
        }
      }
    }
  }
  return;
}

Assistant:

void DPusher::Tick ()
{
	sector_t *sec;
	AActor *thing;
	msecnode_t *node;
	double ht;

	if (!var_pushers)
		return;

	sec = sectors + m_Affectee;

	// Be sure the special sector type is still turned on. If so, proceed.
	// Else, bail out; the sector type has been changed on us.

	if (!(sec->Flags & SECF_PUSH))
		return;

	// For constant pushers (wind/current) there are 3 situations:
	//
	// 1) Affected Thing is above the floor.
	//
	//    Apply the full force if wind, no force if current.
	//
	// 2) Affected Thing is on the ground.
	//
	//    Apply half force if wind, full force if current.
	//
	// 3) Affected Thing is below the ground (underwater effect).
	//
	//    Apply no force if wind, full force if current.
	//
	// Apply the effect to clipped players only for now.
	//
	// In Phase II, you can apply these effects to Things other than players.
	// [RH] No Phase II, but it works with anything having MF2_WINDTHRUST now.

	if (m_Type == p_push)
	{
		// Seek out all pushable things within the force radius of this
		// point pusher. Crosses sectors, so use blockmap.

		FPortalGroupArray check(FPortalGroupArray::PGA_NoSectorPortals);	// no sector portals because this thing is utterly z-unaware.
		FMultiBlockThingsIterator it(check, m_Source, m_Radius);
		FMultiBlockThingsIterator::CheckResult cres;


		while (it.Next(&cres))
		{
			AActor *thing = cres.thing;
			// Normal ZDoom is based only on the WINDTHRUST flag, with the noclip cheat as an exemption.
			bool pusharound = ((thing->flags2 & MF2_WINDTHRUST) && !(thing->flags & MF_NOCLIP));
					
			// MBF allows any sentient or shootable thing to be affected, but players with a fly cheat aren't.
			if (compatflags & COMPATF_MBFMONSTERMOVE)
			{
				pusharound = ((pusharound || (thing->IsSentient()) || (thing->flags & MF_SHOOTABLE)) // Add categories here
					&& (!(thing->player && (thing->flags & (MF_NOGRAVITY))))); // Exclude flying players here
			}

			if ((pusharound) )
			{
				DVector2 pos = m_Source->Vec2To(thing);
				double dist = pos.Length();
				double speed = (m_Magnitude - (dist/2)) / (PUSH_FACTOR * 2);

				// If speed <= 0, you're outside the effective radius. You also have
				// to be able to see the push/pull source point.

				if ((speed > 0) && (P_CheckSight (thing, m_Source, SF_IGNOREVISIBILITY)))
				{
					DAngle pushangle = pos.Angle();
					if (m_Source->GetClass()->TypeName == NAME_PointPuller) pushangle += 180;  
					thing->Thrust(pushangle, speed);
				}
			}
		}
		return;
	}

	// constant pushers p_wind and p_current

	node = sec->touching_thinglist; // things touching this sector
	for ( ; node ; node = node->m_snext)
	{
		thing = node->m_thing;
		if (!(thing->flags2 & MF2_WINDTHRUST) || (thing->flags & MF_NOCLIP))
			continue;

		sector_t *hsec = sec->GetHeightSec();
		DVector3 pos = thing->PosRelative(sec);
		DVector2 pushvel;
		if (m_Type == p_wind)
		{
			if (hsec == NULL)
			{ // NOT special water sector
				if (thing->Z() > thing->floorz) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else // on ground
				{
					pushvel = m_PushVec / 2; // half force
				}
			}
			else // special water sector
			{
				ht = hsec->floorplane.ZatPoint(pos);
				if (thing->Z() > ht) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else if (thing->player->viewz < ht) // underwater
				{
					pushvel.Zero(); // no force
				}
				else // wading in water
				{
					pushvel = m_PushVec / 2; // full force
				}
			}
		}
		else // p_current
		{
			const secplane_t *floor;

			if (hsec == NULL)
			{ // NOT special water sector
				floor = &sec->floorplane;
			}
			else
			{ // special water sector
				floor = &hsec->floorplane;
			}
			if (thing->Z() > floor->ZatPoint(pos))
			{ // above ground
				pushvel.Zero(); // no force
			}
			else
			{ // on ground/underwater
				pushvel = m_PushVec; // full force
			}
		}
		thing->Vel += pushvel / PUSH_FACTOR;
	}
}